

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O2

void __thiscall vera::Camera::updateProjectionViewMatrix(Camera *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_a8;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aStack_a4;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aStack_a0;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aStack_9c;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 local_98;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aStack_94;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aStack_90;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aStack_8c;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_88;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aStack_84;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aStack_80;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aStack_7c;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_78;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aStack_74;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aStack_70;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aStack_6c;
  mat<3,_3,_float,_(glm::qualifier)0> local_68;
  mat<3,_3,_float,_(glm::qualifier)0> local_44;
  
  iVar1 = (*(this->super_Node)._vptr_Node[0x56])();
  glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)&local_a8,&this->m_projectionMatrix,
                 (mat<4,_4,_float,_(glm::qualifier)0> *)CONCAT44(extraout_var,iVar1));
  (this->m_projectionViewMatrix).value[3].field_0 = local_78;
  (this->m_projectionViewMatrix).value[3].field_1 = aStack_74;
  (this->m_projectionViewMatrix).value[3].field_2 = aStack_70;
  (this->m_projectionViewMatrix).value[3].field_3 = aStack_6c;
  *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
   ((this->m_projectionViewMatrix).value + 2) = local_88;
  (this->m_projectionViewMatrix).value[2].field_1 = aStack_84;
  (this->m_projectionViewMatrix).value[2].field_2 = aStack_80;
  (this->m_projectionViewMatrix).value[2].field_3 = aStack_7c;
  *(anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 *)
   ((this->m_projectionViewMatrix).value + 1) = local_98;
  (this->m_projectionViewMatrix).value[1].field_1 = aStack_94;
  (this->m_projectionViewMatrix).value[1].field_2 = aStack_90;
  (this->m_projectionViewMatrix).value[1].field_3 = aStack_8c;
  (this->m_projectionViewMatrix).value[0].field_0 = local_a8;
  (this->m_projectionViewMatrix).value[0].field_1 = aStack_a4;
  (this->m_projectionViewMatrix).value[0].field_2 = aStack_a0;
  (this->m_projectionViewMatrix).value[0].field_3 = aStack_9c;
  iVar1 = (*(this->super_Node)._vptr_Node[0x56])(this);
  glm::mat<3,_3,_float,_(glm::qualifier)0>::mat
            (&local_68,(mat<4,_4,_float,_(glm::qualifier)0> *)CONCAT44(extraout_var_00,iVar1));
  glm::detail::compute_inverse<3,_3,_float,_(glm::qualifier)0,_false>::call(&local_68);
  glm::detail::compute_transpose<3,_3,_float,_(glm::qualifier)0,_false>::call
            ((mat<3,_3,_float,_(glm::qualifier)0> *)&local_a8,&local_44);
  (this->m_normalMatrix).value[2].field_2 = local_88;
  (this->m_normalMatrix).value[1].field_1 = local_98;
  (this->m_normalMatrix).value[1].field_2 =
       (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)aStack_94;
  *(anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 *)
   ((this->m_normalMatrix).value + 2) = aStack_90;
  (this->m_normalMatrix).value[2].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)aStack_8c;
  (this->m_normalMatrix).value[0].field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_a8;
  (this->m_normalMatrix).value[0].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)aStack_a4;
  (this->m_normalMatrix).value[0].field_2 =
       (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)aStack_a0;
  *(anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *)
   ((this->m_normalMatrix).value + 1) = aStack_9c;
  iVar1 = (*(this->super_Node)._vptr_Node[0x56])(this);
  inverseMatrix((mat4 *)&local_a8,(mat4 *)CONCAT44(extraout_var_01,iVar1));
  (this->m_inverseViewMatrix).value[3].field_0 = local_78;
  (this->m_inverseViewMatrix).value[3].field_1 = aStack_74;
  (this->m_inverseViewMatrix).value[3].field_2 = aStack_70;
  (this->m_inverseViewMatrix).value[3].field_3 = aStack_6c;
  (this->m_inverseViewMatrix).value[2].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)local_88;
  (this->m_inverseViewMatrix).value[2].field_1 = aStack_84;
  (this->m_inverseViewMatrix).value[2].field_2 = aStack_80;
  (this->m_inverseViewMatrix).value[2].field_3 = aStack_7c;
  (this->m_inverseViewMatrix).value[1].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)local_98;
  (this->m_inverseViewMatrix).value[1].field_1 = aStack_94;
  (this->m_inverseViewMatrix).value[1].field_2 = aStack_90;
  (this->m_inverseViewMatrix).value[1].field_3 = aStack_8c;
  (this->m_inverseViewMatrix).value[0].field_0 = local_a8;
  (this->m_inverseViewMatrix).value[0].field_1 = aStack_a4;
  (this->m_inverseViewMatrix).value[0].field_2 = aStack_a0;
  (this->m_inverseViewMatrix).value[0].field_3 = aStack_9c;
  inverseMatrix((mat4 *)&local_a8,&this->m_projectionMatrix);
  (this->m_inverseProjectionMatrix).value[3].field_0 = local_78;
  (this->m_inverseProjectionMatrix).value[3].field_1 = aStack_74;
  (this->m_inverseProjectionMatrix).value[3].field_2 = aStack_70;
  (this->m_inverseProjectionMatrix).value[3].field_3 = aStack_6c;
  (this->m_inverseProjectionMatrix).value[2].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)local_88;
  (this->m_inverseProjectionMatrix).value[2].field_1 = aStack_84;
  (this->m_inverseProjectionMatrix).value[2].field_2 = aStack_80;
  (this->m_inverseProjectionMatrix).value[2].field_3 = aStack_7c;
  (this->m_inverseProjectionMatrix).value[1].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)local_98;
  (this->m_inverseProjectionMatrix).value[1].field_1 = aStack_94;
  (this->m_inverseProjectionMatrix).value[1].field_2 = aStack_90;
  (this->m_inverseProjectionMatrix).value[1].field_3 = aStack_8c;
  (this->m_inverseProjectionMatrix).value[0].field_0 = local_a8;
  (this->m_inverseProjectionMatrix).value[0].field_1 = aStack_a4;
  (this->m_inverseProjectionMatrix).value[0].field_2 = aStack_a0;
  (this->m_inverseProjectionMatrix).value[0].field_3 = aStack_9c;
  (this->super_Node).bChange = true;
  return;
}

Assistant:

void Camera::updateProjectionViewMatrix() {
    m_projectionViewMatrix = m_projectionMatrix * getViewMatrix();
    m_normalMatrix = glm::transpose(glm::inverse(glm::mat3(getViewMatrix())));

    m_inverseViewMatrix = vera::inverseMatrix(getViewMatrix());
    m_inverseProjectionMatrix = vera::inverseMatrix(m_projectionMatrix);
    
    bChange = true;
}